

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Vec_Ptr_t *
Acb_GenerateSignalNames
          (Acb_Ntk_t *p,Vec_Int_t *vDivs,Vec_Int_t *vUsed,int nNodes,Vec_Int_t *vTars,
          Vec_Wec_t *vGates)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void **__s;
  Vec_Str_t *p_00;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint local_74;
  
  uVar11 = vUsed->nSize;
  local_74 = nNodes + uVar11;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  uVar2 = 8;
  if (6 < (nNodes + uVar11) - 1) {
    uVar2 = local_74;
  }
  pVVar4->nCap = uVar2;
  if (uVar2 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)(int)uVar2 << 3);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = local_74;
  uVar12 = 0;
  memset(__s,0,(long)(int)local_74 << 3);
  p_00 = (Vec_Str_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  pcVar5 = (char *)malloc(1000);
  p_00->pArray = pcVar5;
  uVar2 = local_74;
  if (0 < (int)uVar11) {
    uVar9 = 0;
    if (0 < (int)local_74) {
      uVar9 = (ulong)local_74;
    }
    do {
      iVar3 = vUsed->pArray[uVar12];
      if (((long)iVar3 < 0) || (vDivs->nSize <= iVar3)) goto LAB_00398ed1;
      uVar11 = vDivs->pArray[iVar3];
      if ((long)(int)uVar11 < 1) goto LAB_00398f0f;
      uVar2 = (p->vObjName).nSize;
      if ((int)uVar2 < 1) goto LAB_00398f2e;
      if (uVar2 <= uVar11) goto LAB_00398ed1;
      pcVar6 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[(int)uVar11]);
      if (pcVar6 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        sVar7 = strlen(pcVar6);
        pcVar8 = (char *)malloc(sVar7 + 1);
        strcpy(pcVar8,pcVar6);
      }
      if (uVar9 == uVar12) goto LAB_00398ef0;
      __s[uVar12] = pcVar8;
      uVar12 = uVar12 + 1;
      uVar11 = vUsed->nSize;
    } while ((long)uVar12 < (long)(int)uVar11);
    uVar2 = nNodes + uVar11;
  }
  if (vGates->nSize != uVar2 + vTars->nSize) {
    __assert_fail("Vec_WecSize(vGates) == Vec_IntSize(vUsed) + nNodes + Vec_IntSize(vTars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                  ,0x75b,
                  "Vec_Ptr_t *Acb_GenerateSignalNames(Acb_Ntk_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Wec_t *)"
                 );
  }
  if (0 < vTars->nSize) {
    lVar10 = 0;
    do {
      uVar12 = (ulong)(uint)vUsed->nSize + (ulong)(uint)nNodes + lVar10;
      iVar3 = (int)uVar12;
      if ((iVar3 < 0) || (vGates->nSize <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      uVar12 = uVar12 & 0xffffffff;
      iVar3 = vGates->pArray[uVar12].nSize;
      if (iVar3 < 1) {
LAB_00398ed1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar1 = vGates->pArray[uVar12].pArray;
      if (*piVar1 != 0xb) {
        __assert_fail("Vec_IntEntry(vGate, 0) == ABC_OPER_BIT_BUF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                      ,0x75f,
                      "Vec_Ptr_t *Acb_GenerateSignalNames(Acb_Ntk_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Wec_t *)"
                     );
      }
      if (iVar3 == 1) goto LAB_00398ed1;
      uVar11 = vTars->pArray[lVar10];
      if ((int)uVar11 < 1) {
LAB_00398f0f:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x10e,"char *Acb_ObjNameStr(Acb_Ntk_t *, int)");
      }
      uVar2 = (p->vObjName).nSize;
      if ((int)uVar2 < 1) {
LAB_00398f2e:
        __assert_fail("Acb_NtkHasObjNames(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
      }
      if (uVar2 <= uVar11) goto LAB_00398ed1;
      uVar2 = piVar1[1];
      pcVar6 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[uVar11]);
      if (pcVar6 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        sVar7 = strlen(pcVar6);
        pcVar8 = (char *)malloc(sVar7 + 1);
        strcpy(pcVar8,pcVar6);
      }
      if (((int)uVar2 < 0) || ((int)local_74 <= (int)uVar2)) goto LAB_00398ef0;
      __s[uVar2] = pcVar8;
      lVar10 = lVar10 + 1;
    } while (lVar10 < vTars->nSize);
    uVar11 = vUsed->nSize;
  }
  if (0 < nNodes) {
    uVar9 = (ulong)uVar11;
    uVar12 = 1;
    uVar2 = uVar11;
    do {
      if (((int)uVar11 < 0) || ((int)local_74 <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (__s[uVar9] == (void *)0x0) {
        Vec_StrPrintF(p_00,"ww%d",uVar12);
        uVar2 = p_00->nSize;
        if (uVar2 == p_00->nCap) {
          if ((int)uVar2 < 0x10) {
            pcVar5 = p_00->pArray;
            if (pcVar5 == (char *)0x0) {
              sVar7 = 0x10;
              goto LAB_00398e4d;
            }
            sVar7 = 0x10;
LAB_00398e3c:
            pcVar5 = (char *)realloc(pcVar5,sVar7);
          }
          else {
            sVar7 = (ulong)uVar2 * 2;
            pcVar5 = p_00->pArray;
            if (pcVar5 != (char *)0x0) goto LAB_00398e3c;
LAB_00398e4d:
            pcVar5 = (char *)malloc(sVar7);
          }
          p_00->pArray = pcVar5;
        }
        else {
          pcVar5 = p_00->pArray;
        }
        pcVar5[(int)uVar2] = '\0';
        pcVar5 = p_00->pArray;
        p_00->nCap = 0;
        p_00->nSize = 0;
        p_00->pArray = (char *)0x0;
        local_74 = pVVar4->nSize;
        if ((int)local_74 <= (int)uVar9) {
LAB_00398ef0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        uVar12 = (ulong)((int)uVar12 + 1);
        __s = pVVar4->pArray;
        __s[uVar9] = pcVar5;
        uVar2 = vUsed->nSize;
        pcVar5 = (char *)0x0;
      }
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < (int)(nNodes + uVar2));
  }
  if (pcVar5 != (char *)0x0) {
    free(pcVar5);
  }
  free(p_00);
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Acb_GenerateSignalNames( Acb_Ntk_t * p, Vec_Int_t * vDivs, Vec_Int_t * vUsed, int nNodes, Vec_Int_t * vTars, Vec_Wec_t * vGates )
{
    Vec_Ptr_t * vRes = Vec_PtrStart( Vec_IntSize(vUsed) + nNodes );
    Vec_Str_t * vStr = Vec_StrAlloc(1000); int i, iObj, nWires = 1;
    // create input names
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
        Vec_PtrWriteEntry( vRes, i, Abc_UtilStrsav(Acb_ObjNameStr(p, iObj)) );
    // create names for nodes driving outputs
    assert( Vec_WecSize(vGates) == Vec_IntSize(vUsed) + nNodes + Vec_IntSize(vTars) );
    Vec_IntForEachEntry( vTars, iObj, i )
    {
        Vec_Int_t * vGate = Vec_WecEntry( vGates, Vec_IntSize(vUsed) + nNodes + i );
        assert( Vec_IntEntry(vGate, 0) == ABC_OPER_BIT_BUF );
        Vec_PtrWriteEntry( vRes, Vec_IntEntry(vGate, 1), Abc_UtilStrsav(Acb_ObjNameStr(p, iObj)) );
    }
    for ( i = Vec_IntSize(vUsed); i < Vec_IntSize(vUsed) + nNodes; i++ )
        if ( Vec_PtrEntry(vRes, i) == NULL )
        {
            Vec_StrPrintF( vStr, "ww%d", nWires++ );
            Vec_StrPush( vStr, '\0' );
            Vec_PtrWriteEntry( vRes, i, Vec_StrReleaseArray(vStr) );
        }
    Vec_StrFree( vStr );
    return vRes;
}